

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::~Element(Element *this)

{
  code *pcVar1;
  bool bVar2;
  reference this_00;
  pointer pEVar3;
  Pool<Rml::ElementMeta> *this_01;
  int local_3c;
  pointer pEStack_38;
  int i;
  Element *child_ancestor;
  ElementPtr *child;
  iterator __end1;
  iterator __begin1;
  OwnedElementList *__range1;
  Element *this_local;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Element_008163c8;
  if ((this->parent != (Element *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(parent == nullptr)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x7a), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  PluginRegistry::NotifyElementDestroy(this);
  __end1 = ::std::
           vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ::begin(&this->children);
  child = (ElementPtr *)
          ::std::
          vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
          ::end(&this->children);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                                     *)&child), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
              ::operator*(&__end1);
    pEStack_38 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(this_00);
    local_3c = 0;
    for (; local_3c < 3 && pEStack_38 != (Element *)0x0; pEStack_38 = GetParentNode(pEStack_38)) {
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(this_00);
      (*(pEStack_38->super_ScriptInterface).super_Releasable._vptr_Releasable[0x14])
                (pEStack_38,pEVar3);
      local_3c = local_3c + 1;
    }
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_00);
    SetParent(pEVar3,(Element *)0x0);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
    ::operator++(&__end1);
  }
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::clear(&this->children);
  this->num_non_dom_children = 0;
  this_01 = &ControlledLifetimeResource<Rml::ElementMetaPool>::operator->
                       ((ControlledLifetimeResource<Rml::ElementMetaPool> *)
                        ElementMetaPool::element_meta_pool)->pool;
  Pool<Rml::ElementMeta>::DestroyAndDeallocate(this_01,this->meta);
  ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::~vector
            (&this->animations);
  ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::~unique_ptr
            (&this->transform_state);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~vector(&this->stacking_context);
  ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::~vector
            (&this->additional_boxes);
  Box::~Box(&this->main_box);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&this->attributes);
  ::std::__cxx11::string::~string((string *)&this->id);
  ::std::__cxx11::string::~string((string *)&this->tag);
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::~vector(&this->children);
  EnableObserverPtr<Rml::Element>::~EnableObserverPtr(&this->super_EnableObserverPtr<Rml::Element>);
  ScriptInterface::~ScriptInterface(&this->super_ScriptInterface);
  return;
}

Assistant:

Element::~Element()
{
	RMLUI_ASSERT(parent == nullptr);

	PluginRegistry::NotifyElementDestroy(this);

	// A simplified version of RemoveChild() for destruction.
	for (ElementPtr& child : children)
	{
		Element* child_ancestor = child.get();
		for (int i = 0; i <= ChildNotifyLevels && child_ancestor; i++, child_ancestor = child_ancestor->GetParentNode())
			child_ancestor->OnChildRemove(child.get());

		child->SetParent(nullptr);
	}

	children.clear();
	num_non_dom_children = 0;

	ElementMetaPool::element_meta_pool->pool.DestroyAndDeallocate(meta);
}